

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

dropt_error parse_option_arg(dropt_context *context,parse_state *ps)

{
  dropt_option *option;
  bool bVar1;
  dropt_error dVar2;
  dropt_char *optionArgument;
  
  option = ps->option;
  optionArgument = ps->optionArgument;
  if (optionArgument == (dropt_char *)0x0 && option->arg_description != (dropt_char *)0x0) {
    if ((0 < ps->argsLeft) && (optionArgument = *ps->argNext, optionArgument != (dropt_char *)0x0))
    {
      ps->optionArgument = optionArgument;
      bVar1 = true;
      goto LAB_00103323;
    }
    if ((option->attr & 4) == 0) {
      return 5;
    }
    optionArgument = (dropt_char *)0x0;
  }
  bVar1 = false;
LAB_00103323:
  dVar2 = set_option_value(context,option,optionArgument);
  if (dVar2 == 0) {
    dVar2 = 0;
    if (bVar1) {
      ps->argNext = ps->argNext + 1;
      ps->argsLeft = ps->argsLeft + -1;
    }
  }
  else if ((bVar1 && (ps->option->attr & 4) != 0) && (ps->optionArgument != (dropt_char *)0x0)) {
    ps->optionArgument = (dropt_char *)0x0;
    dVar2 = set_option_value(context,ps->option,(dropt_char *)0x0);
    return dVar2;
  }
  return dVar2;
}

Assistant:

static dropt_error
parse_option_arg(dropt_context* context, parse_state* ps)
{
    dropt_error err;

    bool consumeNextArg = false;

    if (OPTION_TAKES_ARG(ps->option) && ps->optionArgument == NULL)
    {
        /* The option expects an argument, but none was specified with '='.
         * Try using the next item from the command-line.
         */
        if (ps->argsLeft > 0 && *(ps->argNext) != NULL)
        {
            consumeNextArg = true;
            ps->optionArgument = *(ps->argNext);
        }
        else if (!(ps->option->attr & dropt_attr_optional_val))
        {
            err = dropt_error_insufficient_arguments;
            goto exit;
        }
    }

    /* Even for options that don't ask for arguments, always parse and
     * consume an argument that was specified with '='.
     */
    err = set_option_value(context, ps->option, ps->optionArgument);

    if (   err != dropt_error_none
        && (ps->option->attr & dropt_attr_optional_val)
        && consumeNextArg
        && ps->optionArgument != NULL)
    {
        /* The option's handler didn't like the argument we fed it.  If the
         * argument was optional, try again without it.
         */
        consumeNextArg = false;
        ps->optionArgument = NULL;
        err = set_option_value(context, ps->option, NULL);
    }

exit:
    if (err == dropt_error_none && consumeNextArg)
    {
        ps->argNext++;
        ps->argsLeft--;
    }
    return err;
}